

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

string_type * booster::operator+(string_type *l,sub_match<const_char_*> *r)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string_type *in_RDI;
  string_type *__rhs;
  string local_38 [16];
  sub_match<const_char_*> *in_stack_ffffffffffffffd8;
  
  __rhs = in_RDI;
  sub_match<char_const*>::str_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::operator+(in_RSI,__rhs);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

typename sub_match<Iterator>::string_type 
	operator+(typename sub_match<Iterator>::string_type const &l,sub_match<Iterator> const &r)
	{ return l + r.str(); }